

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::
TypedTimeSamples<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>::
update(TypedTimeSamples<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>
       *this)

{
  iterator iVar1;
  iterator iVar2;
  TypedTimeSamples<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>
  *this_local;
  
  iVar1 = ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>::Sample>_>
          ::begin(&this->_samples);
  iVar2 = ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>::Sample>_>
          ::end(&this->_samples);
  ::std::
  sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>::Sample*,std::vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>::Sample>>>,tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>::update()const::_lambda(tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>::Sample_const&,tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>::Sample_const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }